

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-dump.c
# Opt level: O3

gboolean loudness_dump_parse(int *argc,char ***argv)

{
  gboolean gVar1;
  
  if (decode_to_file == (gchar *)0x0) {
    gVar1 = parse_mode_args(argc,argv,entries);
    if (gVar1 == 0) {
      if (*argc != 1) {
        return 0;
      }
      loudness_dump_parse_cold_4();
      return 0;
    }
    if (((byte)((-(momentary != 0.0) & 1U) + (shortterm != 0.0) + (integrated != 0.0)) == '\x01') &&
       (interval = momentary + shortterm + integrated, 0.0 < interval)) {
      if ((momentary <= 0.4) && (shortterm <= 3.0)) {
        return 1;
      }
      loudness_dump_parse_cold_3();
      return 1;
    }
    loudness_dump_parse_cold_2();
  }
  else {
    loudness_dump_parse_cold_1();
  }
  return 0;
}

Assistant:

gboolean
loudness_dump_parse(int *argc, char **argv[])
{
	if (decode_to_file) {
		fprintf(stderr, "Cannot decode to file in dump mode\n");
		return FALSE;
	}

	if (!parse_mode_args(argc, argv, entries)) {
		if (*argc == 1)
			fprintf(stderr, "Missing arguments\n");
		return FALSE;
	}

	if ((momentary != 0.0) + (shortterm != 0.0) + (integrated != 0.0) !=
		1 ||
	    (interval = momentary + shortterm + integrated) <= 0.0) {
		fprintf(stderr,
		    "Exactly one of -m, -s and -i must be positive!\n");
		return FALSE;
	}

	if (momentary > 0.4 || shortterm > 3.0) {
		fprintf(stderr,
		    "Warning: you may lose samples when specifying "
		    "this interval!\n");
	}
	return TRUE;
}